

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_stores(void)

{
  wchar_t wVar1;
  
  wVar1 = rd_stores_aux(rd_item);
  return wVar1;
}

Assistant:

int rd_stores(void) { return rd_stores_aux(rd_item); }